

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsPopupOpen(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  ImGuiContext_conflict *pIVar1;
  ImGuiPopupData *pIVar2;
  bool local_25;
  int local_24;
  int n;
  ImGuiContext_conflict *g;
  ImGuiPopupFlags popup_flags_local;
  ImGuiID id_local;
  
  pIVar1 = GImGui;
  if ((popup_flags & 0x80U) == 0) {
    if ((popup_flags & 0x100U) == 0) {
      local_25 = false;
      if ((GImGui->BeginPopupStack).Size < (GImGui->OpenPopupStack).Size) {
        pIVar2 = ImVector<ImGuiPopupData>::operator[]
                           (&GImGui->OpenPopupStack,(GImGui->BeginPopupStack).Size);
        local_25 = pIVar2->PopupId == id;
      }
      popup_flags_local._3_1_ = local_25;
    }
    else {
      for (local_24 = 0; local_24 < (pIVar1->OpenPopupStack).Size; local_24 = local_24 + 1) {
        pIVar2 = ImVector<ImGuiPopupData>::operator[](&pIVar1->OpenPopupStack,local_24);
        if (pIVar2->PopupId == id) {
          return true;
        }
      }
      popup_flags_local._3_1_ = false;
    }
  }
  else {
    if (id != 0) {
      __assert_fail("id == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x22c2,"bool ImGui::IsPopupOpen(ImGuiID, ImGuiPopupFlags)");
    }
    if ((popup_flags & 0x100U) == 0) {
      popup_flags_local._3_1_ = (GImGui->BeginPopupStack).Size < (GImGui->OpenPopupStack).Size;
    }
    else {
      popup_flags_local._3_1_ = 0 < (GImGui->OpenPopupStack).Size;
    }
  }
  return popup_flags_local._3_1_;
}

Assistant:

bool ImGui::IsPopupOpen(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    if (popup_flags & ImGuiPopupFlags_AnyPopupId)
    {
        // Return true if any popup is open at the current BeginPopup() level of the popup stack
        // This may be used to e.g. test for another popups already opened to handle popups priorities at the same level.
        IM_ASSERT(id == 0);
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
            return g.OpenPopupStack.Size > 0;
        else
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size;
    }
    else
    {
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
        {
            // Return true if the popup is open anywhere in the popup stack
            for (int n = 0; n < g.OpenPopupStack.Size; n++)
                if (g.OpenPopupStack[n].PopupId == id)
                    return true;
            return false;
        }
        else
        {
            // Return true if the popup is open at the current BeginPopup() level of the popup stack (this is the most-common query)
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].PopupId == id;
        }
    }
}